

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_net.cpp
# Opt level: O0

void D_CheckNetGame(void)

{
  int iVar1;
  char *pcVar2;
  char *pcVar3;
  char local_28 [8];
  char filename [20];
  int i;
  char *v;
  
  filename[0xc] = '\0';
  filename[0xd] = '\0';
  filename[0xe] = '\0';
  filename[0xf] = '\0';
  for (; (int)filename._12_4_ < 8; filename._12_4_ = filename._12_4_ + 1) {
    nodeingame[(int)filename._12_4_] = false;
    nettics[(int)filename._12_4_] = 0;
    remoteresend[(int)filename._12_4_] = false;
    resendto[(int)filename._12_4_] = 0;
  }
  register0x00000000 = DArgs::CheckValue(Args,"-netmode");
  if ((register0x00000000 != (char *)0x0) && (iVar1 = atoi(register0x00000000), iVar1 != 0)) {
    Printf(
          "\x1cKNotice: Using PacketServer (netmode 1) over the internet is prone to running too slow on some internet configurations.\nIf the game is running well below expected speeds, use netmode 0 (P2P) instead.\n"
          );
  }
  I_InitNetwork();
  if (doomcom.id != 0x12345678) {
    I_FatalError("Doomcom buffer invalid!");
  }
  DAT_01ae7251 = 1;
  consoleplayer = (int)doomcom.consoleplayer;
  if (consoleplayer == Net_Arbitrator) {
    register0x00000000 = DArgs::CheckValue(Args,"-netmode");
    if (register0x00000000 != (char *)0x0) {
      iVar1 = atoi(register0x00000000);
      NetMode = iVar1 != 0;
    }
    if (1 < doomcom.numnodes) {
      pcVar3 = "packet server";
      if (NetMode == '\0') {
        pcVar3 = "peer to peer";
      }
      pcVar2 = "auto";
      if (stack0xfffffffffffffff0 != (char *)0x0) {
        pcVar2 = "forced";
      }
      Printf("Selected \x1cH%s\x1c- networking mode. (%s)\n",pcVar3,pcVar2);
    }
    iVar1 = DArgs::CheckParm(Args,"-extratic",1);
    if (iVar1 != 0) {
      FIntCVar::operator=(&net_extratic,1);
    }
  }
  D_SetupUserInfo();
  iVar1 = DArgs::CheckParm(Args,"-debugfile",1);
  if (iVar1 != 0) {
    mysnprintf(local_28,0x14,"debug%i.txt",(ulong)(uint)consoleplayer);
    Printf("debug output to: %s\n",local_28);
    debugfile = (FILE *)fopen(local_28,"w");
  }
  if ((netgame & 1U) != 0) {
    FGameConfigFile::ReadNetVars(GameConfig);
    D_ArbitrateNetStart();
  }
  ticdup = (int)doomcom.ticdup;
  filename[0xc] = '\0';
  filename[0xd] = '\0';
  filename[0xe] = '\0';
  filename[0xf] = '\0';
  for (; (int)filename._12_4_ < (int)doomcom.numplayers; filename._12_4_ = filename._12_4_ + 1) {
    playeringame[(int)filename._12_4_] = true;
  }
  filename[0xc] = '\0';
  filename[0xd] = '\0';
  filename[0xe] = '\0';
  filename[0xf] = '\0';
  for (; (int)filename._12_4_ < (int)doomcom.numnodes; filename._12_4_ = filename._12_4_ + 1) {
    nodeingame[(int)filename._12_4_] = true;
  }
  if ((consoleplayer != Net_Arbitrator) && (1 < doomcom.numnodes)) {
    pcVar3 = "packet server";
    if (NetMode == '\0') {
      pcVar3 = "peer to peer";
    }
    Printf("Arbitrator selected \x1cH%s\x1c- networking mode.\n",pcVar3);
  }
  if ((batchrun & 1U) == 0) {
    Printf("player %i of %i (%i nodes)\n",(ulong)(consoleplayer + 1),
           (ulong)(uint)(int)doomcom.numplayers,(ulong)(uint)(int)doomcom.numnodes);
  }
  return;
}

Assistant:

void D_CheckNetGame (void)
{
	const char *v;
	int i;

	for (i = 0; i < MAXNETNODES; i++)
	{
		nodeingame[i] = false;
		nettics[i] = 0;
		remoteresend[i] = false;		// set when local needs tics
		resendto[i] = 0;				// which tic to start sending
	}

	// Packet server has proven to be rather slow over the internet. Print a warning about it.
	v = Args->CheckValue("-netmode");
	if (v != NULL && (atoi(v) != 0))
	{
		Printf(TEXTCOLOR_YELLOW "Notice: Using PacketServer (netmode 1) over the internet is prone to running too slow on some internet configurations."
			"\nIf the game is running well below expected speeds, use netmode 0 (P2P) instead.\n");
	}

	// I_InitNetwork sets doomcom and netgame
	if (I_InitNetwork ())
	{
		// For now, stop auto selecting PacketServer, as it's more likely to cause confusion.
		//NetMode = NET_PacketServer;
	}
	if (doomcom.id != DOOMCOM_ID)
	{
		I_FatalError ("Doomcom buffer invalid!");
	}
	players[0].settings_controller = true;

	consoleplayer = doomcom.consoleplayer;

	if (consoleplayer == Net_Arbitrator)
	{
		v = Args->CheckValue("-netmode");
		if (v != NULL)
		{
			NetMode = atoi(v) != 0 ? NET_PacketServer : NET_PeerToPeer;
		}
		if (doomcom.numnodes > 1)
		{
			Printf("Selected " TEXTCOLOR_BLUE "%s" TEXTCOLOR_NORMAL " networking mode. (%s)\n", NetMode == NET_PeerToPeer ? "peer to peer" : "packet server",
				v != NULL ? "forced" : "auto");
		}

		if (Args->CheckParm("-extratic"))
		{
			net_extratic = 1;
		}
	}

	// [RH] Setup user info
	D_SetupUserInfo ();

	if (Args->CheckParm ("-debugfile"))
	{
		char filename[20];
		mysnprintf (filename, countof(filename), "debug%i.txt", consoleplayer);
		Printf ("debug output to: %s\n", filename);
		debugfile = fopen (filename, "w");
	}

	if (netgame)
	{
		GameConfig->ReadNetVars ();	// [RH] Read network ServerInfo cvars
		D_ArbitrateNetStart ();
	}

	// read values out of doomcom
	ticdup = doomcom.ticdup;

	for (i = 0; i < doomcom.numplayers; i++)
		playeringame[i] = true;
	for (i = 0; i < doomcom.numnodes; i++)
		nodeingame[i] = true;

	if (consoleplayer != Net_Arbitrator && doomcom.numnodes > 1)
	{
		Printf("Arbitrator selected " TEXTCOLOR_BLUE "%s" TEXTCOLOR_NORMAL " networking mode.\n", NetMode == NET_PeerToPeer ? "peer to peer" : "packet server");
	}

	if (!batchrun) Printf ("player %i of %i (%i nodes)\n",
			consoleplayer+1, doomcom.numplayers, doomcom.numnodes);
}